

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDefines.h
# Opt level: O3

void __thiscall KDIS::KException::KException(KException *this,KUINT16 EC)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  undefined8 uVar3;
  undefined6 in_register_00000032;
  KString *pKVar4;
  size_type __dnew;
  size_type local_18;
  
  *(undefined ***)this = &PTR__KException_00310268;
  this->m_ui16ErrorCode = EC;
  pKVar4 = &this->m_sErrorText;
  paVar1 = &(this->m_sErrorText).field_2;
  (this->m_sErrorText)._M_dataplus._M_p = (pointer)paVar1;
  switch(CONCAT62(in_register_00000032,EC) & 0xffffffff) {
  case 0:
    paVar1->_M_allocated_capacity = 0x726f727245206f4e;
    *(undefined4 *)((long)&(this->m_sErrorText).field_2 + 7) = 0x202e7372;
    (this->m_sErrorText)._M_string_length = 0xb;
    (this->m_sErrorText).field_2._M_local_buf[0xb] = '\0';
    return;
  case 1:
    local_18 = 0x15;
    pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)pKVar4,(ulong)&local_18);
    (this->m_sErrorText)._M_dataplus._M_p = pcVar2;
    (this->m_sErrorText).field_2._M_allocated_capacity = local_18;
    builtin_strncpy(pcVar2,"Buffer Is Too Sm",0x10);
    uVar3 = 0x202e6c6c616d5320;
    goto LAB_0020dde9;
  case 2:
    local_18 = 0x36;
    pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)pKVar4,(ulong)&local_18);
    (this->m_sErrorText)._M_dataplus._M_p = pcVar2;
    (this->m_sErrorText).field_2._M_allocated_capacity = local_18;
    builtin_strncpy(pcVar2,"Buffer Does Not Contain Enough Information To Decode. ",0x36);
    break;
  case 3:
    local_18 = 0x15;
    pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)pKVar4,(ulong)&local_18);
    (this->m_sErrorText)._M_dataplus._M_p = pcVar2;
    (this->m_sErrorText).field_2._M_allocated_capacity = local_18;
    builtin_strncpy(pcVar2,"String Size Too ",0x10);
    uVar3 = 0x202e676942206f6f;
LAB_0020dde9:
    *(undefined8 *)(pcVar2 + 0xd) = uVar3;
    break;
  case 4:
    local_18 = 0x18;
    pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)pKVar4,(ulong)&local_18);
    (this->m_sErrorText)._M_dataplus._M_p = pcVar2;
    (this->m_sErrorText).field_2._M_allocated_capacity = local_18;
    builtin_strncpy(pcVar2,"Data Type Is Too Large. ",0x18);
    break;
  case 5:
    local_18 = 0x28;
    pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)pKVar4,(ulong)&local_18);
    (this->m_sErrorText)._M_dataplus._M_p = pcVar2;
    (this->m_sErrorText).field_2._M_allocated_capacity = local_18;
    builtin_strncpy(pcVar2,"Incorrect PDU Type Specified In Header. ",0x28);
    break;
  case 6:
    local_18 = 0x29;
    pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)pKVar4,(ulong)&local_18);
    (this->m_sErrorText)._M_dataplus._M_p = pcVar2;
    (this->m_sErrorText).field_2._M_allocated_capacity = local_18;
    builtin_strncpy(pcVar2,"Could Not Open File For Reading/Writing. ",0x29);
    break;
  case 7:
    local_18 = 0x37;
    pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)pKVar4,(ulong)&local_18);
    (this->m_sErrorText)._M_dataplus._M_p = pcVar2;
    (this->m_sErrorText).field_2._M_allocated_capacity = local_18;
    builtin_strncpy(pcVar2,"Parameter Is Out Of Bounds/Range Of Acceptable Values. ",0x37);
    break;
  case 8:
    *(undefined8 *)((long)&(this->m_sErrorText).field_2 + 6) = 0x202e617461442064;
    paVar1->_M_allocated_capacity = 0x2064696c61766e49;
    (this->m_sErrorText)._M_string_length = 0xe;
    (this->m_sErrorText).field_2._M_local_buf[0xe] = '\0';
    return;
  case 9:
    local_18 = 0x27;
    pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)pKVar4,(ulong)&local_18);
    (this->m_sErrorText)._M_dataplus._M_p = pcVar2;
    (this->m_sErrorText).field_2._M_allocated_capacity = local_18;
    builtin_strncpy(pcVar2,"Unsupported Data Type, Can Not Decode. ",0x27);
    break;
  case 10:
    local_18 = 0x13;
    pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)pKVar4,(ulong)&local_18);
    (this->m_sErrorText)._M_dataplus._M_p = pcVar2;
    (this->m_sErrorText).field_2._M_allocated_capacity = local_18;
    builtin_strncpy(pcVar2,"Invalid Operation. ",0x13);
    break;
  case 0xb:
    local_18 = 0x31;
    pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)pKVar4,(ulong)&local_18);
    (this->m_sErrorText)._M_dataplus._M_p = pcVar2;
    (this->m_sErrorText).field_2._M_allocated_capacity = local_18;
    builtin_strncpy(pcVar2,"PDU Is Too Large. PDU Must Not Exceed 8192 Bytes.",0x31);
    break;
  case 0xc:
    *(undefined8 *)((long)&(this->m_sErrorText).field_2 + 5) = 0x2e726f7272652074;
    paVar1->_M_allocated_capacity = 0x652074656b636f53;
    (this->m_sErrorText)._M_string_length = 0xd;
    (this->m_sErrorText).field_2._M_local_buf[0xd] = '\0';
    return;
  default:
    local_18 = 0x14;
    pcVar2 = (char *)std::__cxx11::string::_M_create((ulong *)pKVar4,(ulong)&local_18);
    (this->m_sErrorText)._M_dataplus._M_p = pcVar2;
    (this->m_sErrorText).field_2._M_allocated_capacity = local_18;
    builtin_strncpy(pcVar2,"Unknown KDIS Error. ",0x14);
  }
  (this->m_sErrorText)._M_string_length = local_18;
  (this->m_sErrorText)._M_dataplus._M_p[local_18] = '\0';
  return;
}

Assistant:

explicit KException(KUINT16 EC) :
        m_ui16ErrorCode( EC ),
        m_sErrorText( GetErrorText( EC ) )
    {
    }